

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O0

double * __thiscall
mpt::value_store::set<double>(value_store *this,span<const_double> *data,long pos)

{
  type_traits *ptVar1;
  long lVar2;
  iterator pdVar3;
  int local_54;
  int type;
  void *ptr;
  long pos_local;
  span<const_double> *data_local;
  value_store *this_local;
  
  if ((set<double>::traits == (type_traits *)0x0) &&
     (set<double>::traits = type_properties<double>::traits(),
     set<double>::traits == (type_traits *)0x0)) {
    this_local = (value_store *)0x0;
  }
  else {
    ptVar1 = set<double>::traits;
    lVar2 = span<const_double>::size(data);
    pdVar3 = span<const_double>::begin(data);
    this_local = (value_store *)
                 mpt::value_store::set
                           ((type_traits *)this,(ulong)ptVar1,(void *)(lVar2 << 3),(long)pdVar3);
    if (this_local != (value_store *)0x0) {
      local_54 = type_properties<double>::id(false);
      if (local_54 < 1) {
        local_54 = 0;
      }
      this->_type = (uint16_t)local_54;
    }
  }
  return (double *)this_local;
}

Assistant:

T *set(const span<const T> &data, long pos = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		void *ptr = set(*traits, data.size() * sizeof(T), data.begin(), pos);
		if (ptr) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<T *>(ptr);
	}